

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

_Bool quality_action(menu *m,ui_event *event,wchar_t oid)

{
  int count;
  ui_event uVar1;
  region area;
  menu_iter menu_f;
  menu menu;
  region local_108;
  menu_iter local_f8;
  menu local_d0;
  
  local_f8.resize = (_func_void_menu_ptr *)0x0;
  local_f8.display_row = quality_subdisplay;
  local_f8.row_handler = (_func__Bool_menu_ptr_ui_event_ptr_int *)0x0;
  local_f8.get_tag = (_func_char_menu_ptr_int *)0x0;
  local_f8.valid_row = (_func_int_menu_ptr_int *)0x0;
  local_108.width = 0x1d;
  local_108.page_rows = 5;
  local_108.row = oid + L'\x02';
  local_108.col = 0x25;
  screen_save();
  count = 5;
  if ((oid & 0xfffffffeU) == 0x18) {
    local_108.page_rows = 2;
    count = 2;
  }
  menu_init(&local_d0,MN_SKIN_SCROLL,&local_f8);
  menu_setpriv(&local_d0,count,quality_values);
  if (Term->hgt <= local_108.row + local_d0.count) {
    local_108.row = Term->hgt + ~local_d0.count;
  }
  menu_layout(&local_d0,&local_108);
  window_make(local_108.col + L'\xfffffffe',local_108.row + L'\xffffffff',
              local_108.width + local_108.col + L'\x02',local_108.row + local_108.page_rows);
  uVar1 = menu_select(&local_d0,0,true);
  if (uVar1.type == EVT_SELECT) {
    ignore_level[oid] = (uint8_t)local_d0.cursor;
  }
  screen_load();
  return true;
}

Assistant:

static bool quality_action(struct menu *m, const ui_event *event, int oid)
{
	struct menu menu;
	menu_iter menu_f = { NULL, NULL, quality_subdisplay, NULL, NULL };
	region area = { 37, 2, 29, IGNORE_MAX };
	ui_event evt;
	int count;

	/* Display at the right point */
	area.row += oid;

	/* Save */
	screen_save();

	/* Work out how many options we have */
	count = IGNORE_MAX;
	if ((oid == ITYPE_RING) || (oid == ITYPE_AMULET))
		count = area.page_rows = IGNORE_BAD + 1;

	/* Run menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu_setpriv(&menu, count, quality_values);

	/* Stop menus from going off the bottom of the screen */
	if (area.row + menu.count > Term->hgt - 1)
		area.row += Term->hgt - 1 - area.row - menu.count;

	menu_layout(&menu, &area);

	window_make(area.col - 2, area.row - 1, area.col + area.width + 2,
				area.row + area.page_rows);

	evt = menu_select(&menu, 0, true);

	/* Set the new value appropriately */
	if (evt.type == EVT_SELECT)
		ignore_level[oid] = menu.cursor;

	/* Load and finish */
	screen_load();
	return true;
}